

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
Fiber<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1473:7)>
::runImpl(Fiber<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1473:7)>
          *this,WaitScope *waitScope)

{
  ExceptionOr<kj::StringPtr> *this_00;
  ArrayPtr<const_char> local_1d8;
  ExceptionOr<kj::StringPtr> local_1c8;
  WaitScope *local_18;
  WaitScope *waitScope_local;
  Fiber<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1473:7)>
  *this_local;
  
  local_18 = waitScope;
  waitScope_local = (WaitScope *)this;
  local_1d8 = (ArrayPtr<const_char>)
              MaybeVoidCaller<kj::WaitScope&,kj::StringPtr>::
              apply<kj::(anonymous_namespace)::TestCase1464::run()::__0>(&this->func,waitScope);
  ExceptionOr<kj::StringPtr>::ExceptionOr(&local_1c8,(StringPtr *)&local_1d8);
  this_00 = ExceptionOrValue::as<kj::StringPtr>(&(this->result).super_ExceptionOrValue);
  ExceptionOr<kj::StringPtr>::operator=(this_00,&local_1c8);
  ExceptionOr<kj::StringPtr>::~ExceptionOr(&local_1c8);
  return;
}

Assistant:

void runImpl(WaitScope& waitScope) override {
    result.template as<ResultType>() =
        MaybeVoidCaller<WaitScope&, ResultType>::apply(func, waitScope);
  }